

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

Var * __thiscall kratos::Var::get_size_param(Var *this,uint32_t index)

{
  bool bVar1;
  mapped_type *ppVVar2;
  mapped_type local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> local_20;
  uint32_t local_14;
  Var *pVStack_10;
  uint32_t index_local;
  Var *this_local;
  
  local_14 = index;
  pVStack_10 = this;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
       ::find(&this->size_param_,&local_14);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
       ::end(&this->size_param_);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (mapped_type)0x0;
  }
  else {
    ppVVar2 = std::
              unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
              ::at(&this->size_param_,&local_14);
    local_38 = *ppVVar2;
  }
  return local_38;
}

Assistant:

inline Var *get_size_param(uint32_t index) const {
        return size_param_.find(index) == size_param_.end() ? nullptr : size_param_.at(index);
    }